

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O0

SHMPTR SHMInitPool(SHMPTR first,int block_size,int pool_size,SHM_POOL_INFO *pool)

{
  int num_blocks_00;
  SHMPTR last;
  int num_blocks;
  SHM_POOL_INFO *pool_local;
  int pool_size_local;
  int block_size_local;
  SHMPTR first_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  num_blocks_00 = pool_size / block_size;
  first_local = SHMLinkPool(first,block_size,num_blocks_00);
  if (first_local == 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    first_local = 0;
  }
  else {
    pool->first_free = first;
    pool->free_items = num_blocks_00;
    pool->item_size = block_size;
    pool->num_items = num_blocks_00;
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
  }
  return first_local;
}

Assistant:

static SHMPTR SHMInitPool(SHMPTR first, int block_size, int pool_size,
                          SHM_POOL_INFO *pool)
{
    int num_blocks;
    SHMPTR last;

    TRACE("Initializing SHM pool for %d-byte blocks\n", block_size);

    /* Number of memory blocks of size "block_size" that can fit in "pool_size"
       bytes (rounded down) */
    num_blocks = pool_size/block_size;

    /* Create the initial linked list of free blocks */
    last = SHMLinkPool(first, block_size, num_blocks);
    if( 0 == last )
    {
        ERROR("Failed to create linked list of free blocks!\n");
        return 0;
    }

    /* Initialize SHM_POOL_INFO */
    pool->first_free = first;
    pool->free_items = num_blocks;
    pool->item_size = block_size;
    pool->num_items = num_blocks;

    TRACE("New SHM pool extends from SHMPTR 0x%08x to 0x%08x\n", first, last);
    return last;
}